

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O1

sexp_conflict str2utf16(sexp_conflict ctx,char *s,int len,sexp_conflict endianness)

{
  uchar *puVar1;
  int iVar2;
  sexp_conflict psVar3;
  ulong uVar4;
  long lVar5;
  ushort *puVar6;
  long lVar7;
  uchar *puVar8;
  ushort *puVar9;
  
  puVar1 = (uchar *)(s + len);
  lVar7 = 0;
  puVar8 = (uchar *)s;
  if (0 < len) {
    do {
      iVar2 = sexp_utf8_initial_byte_count(*puVar8);
      puVar8 = puVar8 + iVar2;
      lVar7 = lVar7 + (ulong)(iVar2 == 4) + 1;
    } while (puVar8 < puVar1);
  }
  psVar3 = (sexp_conflict)sexp_make_bytes_op(ctx,0,2,lVar7 * 4 + 1,0x43e);
  if ((((ulong)psVar3 & 3) == 0) && (psVar3->tag == 8)) {
    puVar9 = (ushort *)((long)&psVar3->value + 8);
    puVar6 = puVar9;
    if (0 < len) {
      do {
        iVar2 = sexp_utf8_initial_byte_count(*s);
        uVar4 = decode_utf8((uchar *)s,iVar2);
        if (iVar2 == 4) {
          *puVar6 = (short)(uVar4 >> 10) + 0xd7c0;
          puVar6[1] = (ushort)uVar4 & 0x3ff | 0xdc00;
          puVar6 = puVar6 + 2;
        }
        else {
          *puVar6 = (ushort)uVar4;
          puVar6 = puVar6 + 1;
        }
        s = (char *)((uchar *)s + iVar2);
      } while (s < puVar1);
    }
    if (((((ctx->value).type.setters)->value).type.slots != endianness) && (0 < lVar7)) {
      lVar5 = 0;
      do {
        puVar6 = puVar9 + lVar5;
        *puVar6 = *puVar6 << 8 | *puVar6 >> 8;
        lVar5 = lVar5 + 1;
      } while (lVar7 != lVar5);
    }
  }
  return psVar3;
}

Assistant:

sexp str2utf16(sexp ctx, char* s, int len, sexp endianness) {
  unsigned char *p = (unsigned char*) s, *q;
  uint16_t *utf16, hi, lo;
  sexp_sint_t utf16_len, ch_len, ch, i;
  sexp res;
  q = p + len;
  for (utf16_len=0; p<q; ++utf16_len) {
    ch_len = sexp_utf8_initial_byte_count(*p);
    if (ch_len == 4) ++utf16_len;   /* surrogate */
    p += ch_len;
  }
  res = sexp_make_bytes(ctx, sexp_make_fixnum(utf16_len*2), SEXP_VOID);
  if (!sexp_bytesp(res)) return res;
  utf16 = (uint16_t*)sexp_bytes_data(res);
  for (p=(unsigned char*)s; p<q; ) {
    ch_len = sexp_utf8_initial_byte_count(*p);
    ch = decode_utf8(p, ch_len);
    if (ch_len == 4) {
      hi = (0xD800 - (0x10000 >> 10) + ((ch) >> 10));
      lo = (0xDC00 + ((ch) & 0x3FF));
      (*utf16++) = hi;
      (*utf16++) = lo;
    } else {
      (*utf16++) = (uint16_t)ch;
    }
    p += ch_len;
  }
  if (endianness != sexp_global(ctx, SEXP_G_ENDIANNESS)) {
    utf16 = (uint16_t*)sexp_bytes_data(res);
    for (i=0; i<utf16_len; ++i) {
      utf16[i] = sexp_swap_u16(utf16[i]);
    }
  }
  return res;
}